

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::
reject<QtPromise::QPromiseUndefinedException>
          (PromiseDataBase<QString,_void_(const_QString_&)> *this,QPromiseUndefinedException *error)

{
  PromiseError local_20;
  QPromiseUndefinedException *local_18;
  QPromiseUndefinedException *error_local;
  PromiseDataBase<QString,_void_(const_QString_&)> *this_local;
  
  local_18 = error;
  error_local = (QPromiseUndefinedException *)this;
  PromiseError::PromiseError<QtPromise::QPromiseUndefinedException>(&local_20,error);
  PromiseError::operator=(&this->m_error,&local_20);
  PromiseError::~PromiseError(&local_20);
  setSettled(this);
  return;
}

Assistant:

void reject(E&& error)
    {
        Q_ASSERT(isPending());
        Q_ASSERT(m_error.isNull());
        m_error = PromiseError{std::forward<E>(error)};
        setSettled();
    }